

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoted.c
# Opt level: O3

Denoted * get_denoted_typedef(Denoted_Base *base)

{
  Type *pTVar1;
  Denoted *pDVar2;
  
  pDVar2 = (Denoted *)malloc(0x18);
  pDVar2->denotation = DT_Typedef;
  pTVar1 = base->type;
  *(token **)(pDVar2 + 2) = base->id;
  *(Type **)(pDVar2 + 4) = pTVar1;
  return pDVar2;
}

Assistant:

struct Denoted* get_denoted_typedef(struct Denoted_Base *base)
{
	struct Denoted_Typedef *ret;
	ret=malloc(sizeof(struct Denoted_Typedef));
	ret->denotation=DT_Typedef;
	ret->type=base->type;
	ret->id=base->id;

	return (struct Denoted*)ret;

}